

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O2

curi_status
handle_query_item_decodedKey
          (char *key,size_t keyLen,char *value,size_t valueLen,curi_settings *settings,
          void *userData)

{
  size_t sVar1;
  int iVar2;
  curi_status cVar3;
  long lVar4;
  double dVar5;
  char *valueEnd;
  char *local_40;
  size_t local_38;
  
  if (valueLen == 0 &&
      settings->query_item_null_callback != (_func_int_void_ptr_char_ptr_size_t *)0x0) {
    iVar2 = (*settings->query_item_null_callback)(userData,key,keyLen);
  }
  else {
    if (valueLen != 0) {
      if (settings->query_item_int_callback != (_func_int_void_ptr_char_ptr_size_t_long *)0x0) {
        valueEnd = (char *)0x0;
        lVar4 = strtol(value,&valueEnd,10);
        if (valueEnd == value + valueLen) {
          iVar2 = (*settings->query_item_int_callback)(userData,key,keyLen,lVar4);
          goto LAB_00102c47;
        }
      }
      if (settings->query_item_double_callback != (_func_int_void_ptr_char_ptr_size_t_double *)0x0)
      {
        valueEnd = (char *)0x0;
        dVar5 = strtod(value,&valueEnd);
        if (valueEnd == value + valueLen) {
          iVar2 = (*settings->query_item_double_callback)(userData,key,keyLen,dVar5);
          goto LAB_00102c47;
        }
      }
    }
    if (settings->query_item_str_callback ==
        (_func_int_void_ptr_char_ptr_size_t_char_ptr_size_t *)0x0) {
      return curi_status_success;
    }
    if (settings->url_decode != 0) {
      local_38 = valueLen + 1;
      valueEnd = (char *)0x0;
      local_40 = (char *)(*settings->allocate)(userData,local_38);
      sVar1 = local_38;
      cVar3 = curi_url_decode(value,valueLen,local_40,local_38,(size_t *)&valueEnd);
      if (cVar3 == curi_status_success) {
        iVar2 = (*settings->query_item_str_callback)(userData,key,keyLen,local_40,(size_t)valueEnd);
        cVar3 = (curi_status)(iVar2 == 0);
      }
      (*settings->deallocate)(userData,local_40,sVar1);
      return cVar3;
    }
    iVar2 = (*settings->query_item_str_callback)(userData,key,keyLen,value,valueLen);
  }
LAB_00102c47:
  return (uint)(iVar2 == 0);
}

Assistant:

static curi_status handle_query_item_decodedKey(const char* key, size_t keyLen, const char* value, size_t valueLen, const curi_settings* settings, void* userData)
{
    // Key is valid, callbacks exist
    if (settings->query_item_null_callback)
    {
        if (valueLen == 0)
        {
            if (settings->query_item_null_callback(userData, key, keyLen) == 0)
                return curi_status_canceled;
            else
                return curi_status_success;
        }
    }

    if (valueLen != 0 && settings->query_item_int_callback)
    {
        char* valueEnd = 0;
        long int intValue = 0;
        intValue = strtol(value,&valueEnd,10); // Trying to parse an integer
        if (valueEnd == value + valueLen)
        {
            if (settings->query_item_int_callback(userData, key, keyLen, intValue) == 0)
                return curi_status_canceled;
            else
                return curi_status_success;
        }
    }

    if (valueLen != 0 && settings->query_item_double_callback)
    {
        char* valueEnd = 0;
        double doubleValue = 0;
        doubleValue = strtod(value,&valueEnd); // Trying to parse a double
        if (valueEnd == value + valueLen)
        {
            if (settings->query_item_double_callback(userData, key, keyLen, doubleValue) == 0)
                return curi_status_canceled;
            else
                return curi_status_success;
        }
    }

    if (settings->query_item_str_callback)
    {
        if (settings->url_decode == 0)
        {
            if (settings->query_item_str_callback(userData, key, keyLen, value, valueLen) == 0)
                return curi_status_canceled;
            else
                return curi_status_success;
        }
        else
        {
            curi_status status = curi_status_success;

            size_t valueAllocationSize = (valueLen+1) * sizeof(char);
            size_t urlDecodedValueLen = 0;
            char* urlDecodedValue = (char*)settings->allocate(userData, valueAllocationSize);

            status = curi_url_decode(value,valueLen,urlDecodedValue,valueLen+1,&urlDecodedValueLen);

            if (status == curi_status_success)
                if (settings->query_item_str_callback(userData, key, keyLen, urlDecodedValue, urlDecodedValueLen) == 0)
                    status =  curi_status_canceled;

            settings->deallocate(userData, urlDecodedValue, valueAllocationSize);

            return status;
        }
    }

    return curi_status_success;
}